

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase419::~TestCase419(TestCase419 *this)

{
  TestCase419 *this_local;
  
  kj::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(DynamicApi, Has) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestDefaults>());

  // Primitive fields are always present even if set to default.
  EXPECT_TRUE(root.has("int32Field"));
  EXPECT_FALSE(root.has("int32Field", HasMode::NON_DEFAULT));
  root.set("int32Field", 123);
  EXPECT_TRUE(root.has("int32Field"));
  EXPECT_TRUE(root.has("int32Field", HasMode::NON_DEFAULT));
  root.set("int32Field", -12345678);
  EXPECT_TRUE(root.has("int32Field"));
  EXPECT_FALSE(root.has("int32Field", HasMode::NON_DEFAULT));

  // Pointers are absent until initialized.
  EXPECT_FALSE(root.has("structField"));
  EXPECT_FALSE(root.has("structField", HasMode::NON_DEFAULT));
  root.init("structField");
  EXPECT_TRUE(root.has("structField"));
  EXPECT_TRUE(root.has("structField", HasMode::NON_DEFAULT));
}